

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O1

void __thiscall slang::ast::ClassType::computeCycles(ClassType *this)

{
  ClassType *this_00;
  bool bVar1;
  bool bVar2;
  specific_symbol_iterator<slang::ast::ClassPropertySymbol> sVar3;
  Type *this_01;
  ClassPropertySymbol *prop;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_(std::ranges::subrange_kind)0>
  sVar4;
  
  if ((this->super_Scope).deferredMemberIndex != Invalid) {
    Scope::elaborate(&this->super_Scope);
  }
  (this->cachedHasCycles).super__Optional_base<bool,_true,_true>._M_payload.
  super__Optional_payload_base<bool> = (_Optional_payload_base<bool>)0x101;
  sVar4 = Scope::membersOfType<slang::ast::ClassPropertySymbol>(&this->super_Scope);
  sVar3 = sVar4._M_begin.current;
  do {
    bVar1 = sVar3.current != sVar4._M_end.current.current;
    if (!bVar1) {
LAB_00782b8f:
      (this->cachedHasCycles).super__Optional_base<bool,_true,_true>._M_payload.
      super__Optional_payload_base<bool> = (_Optional_payload_base<bool>)0x100;
      return;
    }
    this_01 = DeclaredType::getType((DeclaredType *)(sVar3.current + 1));
    if (this_01->canonical == (Type *)0x0) {
      Type::resolveCanonical(this_01);
    }
    this_00 = (ClassType *)this_01->canonical;
    if ((this_00->super_Type).canonical == (Type *)0x0) {
      Type::resolveCanonical((Type *)this_00);
    }
    if (((((this_00->super_Type).canonical)->super_Symbol).kind == ClassType) &&
       (bVar2 = hasCycles(this_00), bVar2)) {
      if (bVar1) {
        return;
      }
      goto LAB_00782b8f;
    }
    do {
      sVar3.current = (sVar3.current)->nextInScope;
      if (sVar3.current == (Symbol *)0x0) break;
    } while ((sVar3.current)->kind != ClassProperty);
  } while( true );
}

Assistant:

void ClassType::computeCycles() const {
    // Start out by setting hasCycles to true, so that if we call into
    // hasCycles() in a re-entrant fashion we'll see this result right away.
    ensureElaborated();
    cachedHasCycles = true;

    for (auto& prop : membersOfType<ClassPropertySymbol>()) {
        auto& propType = prop.getType().getCanonicalType();
        if (propType.isClass() && propType.as<ClassType>().hasCycles())
            return;
    }

    cachedHasCycles = false;
}